

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O0

int nghttp2_http_parse_priority(nghttp2_extpri *dest,uint8_t *value,size_t valuelen)

{
  int iVar1;
  size_t in_RDX;
  uint8_t *in_RSI;
  undefined8 *in_RDI;
  int rv;
  sf_value val;
  sf_vec key;
  sf_parser sfp;
  nghttp2_extpri pri;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  sf_parser *in_stack_ffffffffffffffa8;
  char *local_50;
  long local_48;
  sf_parser local_40;
  undefined8 local_28;
  undefined8 *local_10;
  int local_4;
  
  local_28 = *in_RDI;
  local_10 = in_RDI;
  sf_parser_init(&local_40,in_RSI,in_RDX);
  while( true ) {
    do {
      while( true ) {
        do {
          iVar1 = sf_parser_dict(in_stack_ffffffffffffffa8,
                                 (sf_vec *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 (sf_value *)
                                 CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
          if (iVar1 != 0) {
            if (iVar1 == -2) {
              *local_10 = local_28;
              local_4 = 0;
            }
            else {
              local_4 = -0x1f5;
            }
            return local_4;
          }
        } while (local_48 != 1);
        if (*local_50 != 'i') break;
        if (in_stack_ffffffffffffff98 != 0) {
          return -0x1f5;
        }
        local_28 = CONCAT44(in_stack_ffffffffffffffa0,(undefined4)local_28);
      }
    } while (*local_50 != 'u');
    if (((in_stack_ffffffffffffff98 != 1) || (in_stack_ffffffffffffffa4 < 0)) ||
       (7 < CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))) break;
    local_28 = CONCAT44(local_28._4_4_,in_stack_ffffffffffffffa0);
  }
  return -0x1f5;
}

Assistant:

int nghttp2_http_parse_priority(nghttp2_extpri *dest, const uint8_t *value,
                                size_t valuelen) {
  nghttp2_extpri pri = *dest;
  sf_parser sfp;
  sf_vec key;
  sf_value val;
  int rv;

  sf_parser_init(&sfp, value, valuelen);

  for (;;) {
    rv = sf_parser_dict(&sfp, &key, &val);
    if (rv != 0) {
      if (rv == SF_ERR_EOF) {
        break;
      }

      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    if (key.len != 1) {
      continue;
    }

    switch (key.base[0]) {
    case 'i':
      if (val.type != SF_TYPE_BOOLEAN) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }

      pri.inc = val.boolean;

      break;
    case 'u':
      if (val.type != SF_TYPE_INTEGER ||
          val.integer < NGHTTP2_EXTPRI_URGENCY_HIGH ||
          NGHTTP2_EXTPRI_URGENCY_LOW < val.integer) {
        return NGHTTP2_ERR_INVALID_ARGUMENT;
      }

      pri.urgency = (uint32_t)val.integer;

      break;
    }
  }

  *dest = pri;

  return 0;
}